

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

Pointer<anurbs::BrepLoop> __thiscall
anurbs::Ref<anurbs::BrepLoop>::data(Ref<anurbs::BrepLoop> *this)

{
  __shared_ptr_access<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  shared_ptr<anurbs::BrepLoop> sVar1;
  Pointer<anurbs::BrepLoop> PVar2;
  Ref<anurbs::BrepLoop> *this_local;
  
  std::
  __shared_ptr_access<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_RSI);
  sVar1 = Entry<anurbs::BrepLoop>::data((Entry<anurbs::BrepLoop> *)this);
  PVar2.super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  PVar2.super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Pointer<anurbs::BrepLoop>)
         PVar2.super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }